

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::redistribute_bits
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t begin,size_t end,
          size_t count)

{
  size_t sVar1;
  subtree_ref t_00;
  value_type vVar2;
  leaf_reference this_00;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  size_t n;
  size_t i;
  size_t i_1;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  bitview<std::vector> bits;
  subtree_ref_base<false> local_a0;
  size_t local_78;
  ulong local_70;
  leaf_reference local_68;
  long local_60;
  long local_58;
  ulong local_50;
  
  uVar5 = end - begin;
  local_50 = count / uVar5;
  bitview<std::vector>::bitview<unsigned_long,void>
            ((bitview<std::vector> *)&stack0xffffffffffffffb8,count);
  lVar4 = 0;
  local_78 = begin;
  for (; sVar6 = local_78, begin < end; begin = begin + 1) {
    local_a0._vector = (bt_impl_t *)&(t.super_subtree_ref_base<false>._vector)->pointers;
    local_a0._index =
         ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
         t.super_subtree_ref_base<false>._index + begin;
    vVar2 = item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                     *)&local_a0);
    lVar7 = lVar4;
    if (vVar2 != 0) {
      subtree_ref_base<false>::child(&local_a0,&t.super_subtree_ref_base<false>,begin);
      sVar6 = local_a0._size;
      subtree_ref_base<false>::child(&local_a0,&t.super_subtree_ref_base<false>,begin);
      local_a0._vector = (bt_impl_t *)subtree_ref_base<false>::leaf(&local_a0);
      local_a0._index = 0;
      local_68 = (leaf_reference)&stack0xffffffffffffffb8;
      lVar7 = sVar6 + lVar4;
      local_a0._height = 0x1000;
      local_60 = lVar4;
      local_58 = lVar7;
      range_reference<bv::internal::bitview<std::vector>>::operator=
                ((range_reference<bv::internal::bitview<std::vector>> *)&local_68,
                 (range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_> *
                 )&local_a0);
    }
    lVar4 = lVar7;
  }
  t_00.super_subtree_ref_base<false>._index = t.super_subtree_ref_base<false>._index;
  t_00.super_subtree_ref_base<false>._vector = t.super_subtree_ref_base<false>._vector;
  t_00.super_subtree_ref_base<false>._height = t.super_subtree_ref_base<false>._height;
  t_00.super_subtree_ref_base<false>._size = t.super_subtree_ref_base<false>._size;
  t_00.super_subtree_ref_base<false>._rank = t.super_subtree_ref_base<false>._rank;
  local_70 = count % uVar5;
  clear_children_counters(this,t_00,local_78,end);
  sVar3 = 0;
  for (; sVar6 < end; sVar6 = sVar6 + 1) {
    bVar8 = local_70 == 0;
    uVar5 = local_70 - 1;
    local_70 = 0;
    if (!bVar8) {
      local_70 = uVar5;
    }
    n = (local_50 + 1) - (ulong)bVar8;
    local_a0._vector = (bt_impl_t *)&(t.super_subtree_ref_base<false>._vector)->pointers;
    local_a0._index =
         ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
         t.super_subtree_ref_base<false>._index + sVar6;
    vVar2 = item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                     *)&local_a0);
    if (vVar2 == 0) {
      subtree_ref::insert_child((subtree_ref *)&t.super_subtree_ref_base<false>,sVar6);
    }
    subtree_ref_base<false>::child(&local_a0,&t.super_subtree_ref_base<false>,sVar6);
    this_00 = subtree_ref_base<false>::leaf(&local_a0);
    bitview<bv::internal::bitarray_t<4096UL>::array>::clear(this_00);
    local_60 = 0;
    local_a0._vector = (bt_impl_t *)&stack0xffffffffffffffb8;
    sVar1 = n + sVar3;
    local_58 = 0x1000;
    local_a0._index = sVar3;
    local_a0._height = sVar1;
    local_68 = this_00;
    range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096ul>::array>>::operator=
              ((range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096ul>::array>> *)
               &local_68,(range_reference<bv::internal::bitview<std::vector>_> *)&local_a0);
    local_a0._vector = (bt_impl_t *)&(t.super_subtree_ref_base<false>._vector)->sizes;
    lVar4 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    local_a0._index = sVar6 + lVar4;
    local_a0._height = lVar4 + this->degree;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
    ::operator+=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
                  *)&local_a0,n);
    sVar3 = bitview<bv::internal::bitarray_t<4096UL>::array>::popcount(this_00);
    local_a0._vector = (bt_impl_t *)&(t.super_subtree_ref_base<false>._vector)->ranks;
    lVar4 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    local_a0._index = sVar6 + lVar4;
    local_a0._height = lVar4 + this->degree;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
    ::operator+=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
                  *)&local_a0,sVar3);
    sVar3 = sVar1;
  }
  if ((0x1000 - this->buffer) * this->buffer <= this->size) {
    for (sVar6 = local_78; sVar6 < end; sVar6 = sVar6 + 1) {
      subtree_ref_base<false>::child(&local_a0,&t.super_subtree_ref_base<false>,sVar6);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8
            );
  return;
}

Assistant:

void bt_impl<W, AP>::redistribute_bits(subtree_ref t,
                                               size_t begin, size_t end,
                                               size_t count)
        {
            size_t b = end - begin; // Number of children to use
            size_t bits_per_leaf = count / b; // Average number of bits per leaf
            size_t rem           = count % b; // Remainder
            
            assert(b == buffer || b == buffer + 1);
            
            // Here we use the existing abstraction of packed_view
            // to accumulate all the bits into a temporary buffer, and
            // subsequently redistribute them to the leaves
            bitview<std::vector> bits(count);
            
            for(size_t i = begin, p = 0; i < end; ++i) {
                if(t.pointers(i) != 0) {
                    size_t step = t.child(i).size();
                    leaf_reference leaf = t.child(i).leaf();
                    bits(p, p + step) = leaf(0, leaf.size());
                    p += step;
                }
            }
            
            clear_children_counters(t, begin, end);
            
            // The redistribution begins.
            for(size_t p = 0, i = begin; i < end; ++i)
            {
                // The remainder is evenly distributed between the first leaves
                size_t n = bits_per_leaf;
                if(rem) {
                    n += 1;
                    rem -= 1;
                }
                
                // Here we take into account the first steps, when
                // we have an empty root to fill up. If we're going to use
                // a children that doesn't exist, we create it.
                //FIXME: remove insert_child() like in redistribute_keys?
                if(t.pointers(i) == 0)
                    t.insert_child(i);
                
                // Take the bits out of the buffer, put them back into the leaf
                leaf_reference leaf = t.child(i).leaf();
                leaf.clear();
                leaf(0, leaf.size()) = bits(p, p + n);
                
                // Increment the counters
                t.sizes(i, degree) += n;
                t.ranks(i, degree) += leaf.popcount();
                
                // Count of the copied bits
                p += n;
                count -= n;
            }
            
            assert(count == 0);
            // This is debug code
            // It's important to stay in shape and not get too fat
            if(size >= (buffer * (leaf_bits - buffer))) {
                for(size_t k = begin; k < end; ++k) {
                    size_t minsize = (buffer *
                                      (leaf_bits - buffer)) /
                                     (buffer + 1);
                    size_t childsize = t.child(k).size();
                    assert(childsize >= minsize);
                    unused(minsize, childsize);
                }
            }
        }